

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

int __thiscall
libcellml::Variable::clone
          (Variable *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  VariableImpl *pVVar2;
  element_type *__fn_00;
  element_type *peVar3;
  void *__child_stack_00;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  Units local_40;
  Variable *this_local;
  VariablePtr *v;
  
  local_40.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
  super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_ = 0;
  local_40.super_enable_shared_from_this<libcellml::Units>._M_weak_this.
  super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  create();
  pVVar2 = pFunc((Variable *)__fn);
  bVar1 = std::operator!=(&pVVar2->mUnits,(nullptr_t)0x0);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pVVar2 = pFunc((Variable *)__fn);
    __fn_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pVVar2->mUnits);
    Units::clone(&local_40,(__fn *)__fn_00,__child_stack_00,__flags,__arg);
    setUnits(peVar3,(UnitsPtr *)&local_40);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&local_40);
  }
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  initialValue_abi_cxx11_(&local_60,(Variable *)__fn);
  setInitialValue(peVar3,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  interfaceType_abi_cxx11_(&local_80,(Variable *)__fn);
  setInterfaceType(peVar3,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Entity::id_abi_cxx11_(&local_a0,(Entity *)__fn);
  Entity::setId((Entity *)peVar3,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  NamedEntity::name_abi_cxx11_(&local_c0,(NamedEntity *)__fn);
  NamedEntity::setName(&peVar3->super_NamedEntity,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  return (int)this;
}

Assistant:

VariablePtr Variable::clone() const
{
    auto v = create();

    if (pFunc()->mUnits != nullptr) {
        v->setUnits(pFunc()->mUnits->clone());
    }
    v->setInitialValue(initialValue());
    v->setInterfaceType(interfaceType());
    v->setId(id());
    v->setName(name());

    return v;
}